

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_python.cpp
# Opt level: O2

bool __thiscall
flatbuffers::python::PythonGenerator::SaveType
          (PythonGenerator *this,string *defname,Namespace *ns,string *classcode,ImportMap *imports,
          string *mod,bool needs_imports)

{
  _Alloc_hider name;
  bool bVar1;
  Namespace *ns_00;
  long lVar2;
  string filename;
  string directories;
  string code;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&code,"",(allocator<char> *)&directories);
  if (classcode->_M_string_length == 0) {
    BaseGenerator::LastNamespacePart_abi_cxx11_(&filename,(BaseGenerator *)ns,ns_00);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_70,"",(allocator<char> *)&local_50);
    directories.field_2._8_8_ = &directories._M_string_length;
    directories._M_dataplus._M_p = (pointer)0x0;
    directories._M_string_length = 0;
    directories.field_2._M_allocated_capacity = 0;
    BeginFile(this,&filename,false,&code,&local_70,(ImportMap *)&directories);
    std::
    _Rb_tree<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Identity<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Identity<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)&directories);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&filename);
    std::operator+(&filename,"# NOTE ",defname);
    std::operator+(&directories,&filename," does not declare any structs or enums\n");
    std::__cxx11::string::append((string *)&code);
    std::__cxx11::string::~string((string *)&directories);
    std::__cxx11::string::~string((string *)&filename);
  }
  else {
    BaseGenerator::LastNamespacePart_abi_cxx11_(&directories,(BaseGenerator *)ns,ns_00);
    BeginFile(this,&directories,needs_imports,&code,mod,imports);
    std::__cxx11::string::~string((string *)&directories);
    std::__cxx11::string::append((string *)&code);
  }
  if ((((this->super_BaseGenerator).parser_)->opts).one_file == true) {
    std::__cxx11::string::string((string *)&directories,(string *)(this->super_BaseGenerator).path_)
    ;
  }
  else {
    Namer::Directories(&directories,&(this->namer_).super_Namer,&ns->components,None,kUpperCamel);
  }
  EnsureDirExists(&directories);
  lVar2 = ((this->super_BaseGenerator).path_)->_M_string_length + 1;
  while (lVar2 != -1) {
    std::__cxx11::string::substr((ulong)&local_50,(ulong)&directories);
    std::operator+(&local_70,&local_50,'/');
    std::operator+(&filename,&local_70,"__init__.py");
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
    name = filename._M_dataplus;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_70,"",(allocator<char> *)&local_50);
    SaveFile(name._M_p,&local_70,false);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&filename);
    lVar2 = std::__cxx11::string::find((char)&directories,0x2f);
  }
  std::operator+(&filename,&directories,defname);
  bVar1 = SaveFile(filename._M_dataplus._M_p,&code,false);
  std::__cxx11::string::~string((string *)&filename);
  std::__cxx11::string::~string((string *)&directories);
  std::__cxx11::string::~string((string *)&code);
  return bVar1;
}

Assistant:

bool SaveType(const std::string &defname, const Namespace &ns,
                const std::string &classcode, const ImportMap &imports,
                const std::string &mod, bool needs_imports) const {
    std::string code = "";
    if (classcode.empty()) {
      BeginFile(LastNamespacePart(ns), false, &code, "", {});
      code += "# NOTE " + defname + " does not declare any structs or enums\n";
    } else {
      BeginFile(LastNamespacePart(ns), needs_imports, &code, mod, imports);
      code += classcode;
    }

    const std::string directories =
        parser_.opts.one_file ? path_ : namer_.Directories(ns.components);
    EnsureDirExists(directories);

    for (size_t i = path_.size() + 1; i != std::string::npos;
         i = directories.find(kPathSeparator, i + 1)) {
      const std::string init_py =
          directories.substr(0, i) + kPathSeparator + "__init__.py";
      SaveFile(init_py.c_str(), "", false);
    }

    const std::string filename = directories + defname;
    return SaveFile(filename.c_str(), code, false);
  }